

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<std::pair<QString,_int>_>::end(QList<std::pair<QString,_int>_> *this)

{
  pair<QString,_int> *n;
  QArrayDataPointer<std::pair<QString,_int>_> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<QString,_int>_> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<std::pair<QString,_int>_> *)0x8bd199);
  QArrayDataPointer<std::pair<QString,_int>_>::operator->(in_RDI);
  n = QArrayDataPointer<std::pair<QString,_int>_>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }